

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ShapeRange * __thiscall
CoreML::ShapeRange::intersect(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  RangeValue RVar3;
  string local_210 [48];
  stringstream local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [376];
  RangeValue local_58;
  RangeValue local_48;
  RangeValue local_38;
  RangeValue local_28;
  ShapeRange *local_18;
  ShapeRange *other_local;
  ShapeRange *this_local;
  
  local_18 = other;
  other_local = this;
  ShapeRange(__return_storage_ptr__);
  RVar3 = minimum(local_18);
  local_28._val = RVar3._val;
  local_28._isUnbound = RVar3._isUnbound;
  bVar1 = RangeValue::operator<=(&this->_minimum,&local_28);
  if (bVar1) {
    RVar3 = minimum(local_18);
    local_38._val = RVar3._val;
    local_38._isUnbound = RVar3._isUnbound;
    setLower(__return_storage_ptr__,&local_38);
  }
  else {
    setLower(__return_storage_ptr__,&this->_minimum);
  }
  RVar3 = maximum(local_18);
  local_48._val = RVar3._val;
  local_48._isUnbound = RVar3._isUnbound;
  bVar1 = RangeValue::operator>=(&this->_maximum,&local_48);
  if (bVar1) {
    RVar3 = maximum(local_18);
    local_58._val = RVar3._val;
    local_58._isUnbound = RVar3._isUnbound;
    setUpper(__return_storage_ptr__,&local_58);
  }
  else {
    setUpper(__return_storage_ptr__,&this->_maximum);
  }
  bVar1 = RangeValue::operator>(&this->_minimum,&this->_maximum);
  if (!bVar1) {
    bVar1 = RangeValue::isUnbound(&this->_minimum);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1e0);
  poVar2 = std::operator<<(local_1d0,"Invalid intersection between ");
  poVar2 = ::operator<<(poVar2,this);
  poVar2 = std::operator<<(poVar2," and ");
  ::operator<<(poVar2,local_18);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this_00,local_210);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange ShapeRange::intersect(const ShapeRange& other) const {

    // These routines will throw if it's invalid (i.e. max < min)
    ShapeRange out;
    if (_minimum <= other.minimum())
        out.setLower(other.minimum());
    else {
        out.setLower(_minimum);
    }

    if (_maximum >= other.maximum())
        out.setUpper(other.maximum());
    else {
        out.setUpper(_maximum);
    }

    if (_minimum > _maximum || _minimum.isUnbound()) {
        std::stringstream ss;
        ss << "Invalid intersection between " << *this << " and " << other;
        throw std::runtime_error(ss.str());
    }

    return out;

}